

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void insertSlice<float>(Box2i *dataWindow,FrameBuffer *frameBuffer,char *name,PixelType pixelType,
                       list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                       *channels)

{
  int iVar1;
  int iVar2;
  _List_node_base *p_Var3;
  iterator __tmp;
  long sizeY;
  Slice local_68 [56];
  
  iVar1 = (dataWindow->max).y;
  sizeY = (long)(((dataWindow->max).x - (dataWindow->min).x) + 1);
  iVar2 = (dataWindow->min).y;
  std::__cxx11::list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>::
  emplace_back<>(channels);
  p_Var3 = (channels->
           super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>).
           _M_impl._M_node.super__List_node_base._M_prev;
  Imf_3_4::Array2D<float>::resizeErase
            ((Array2D<float> *)(p_Var3 + 1),(long)((iVar1 - iVar2) + 1),sizeY);
  Imf_3_4::Slice::Slice
            (local_68,pixelType,
             (char *)((long)p_Var3[2]._M_next +
                     (dataWindow->min).y * sizeY * -4 + (long)(dataWindow->min).x * -4),4,sizeY << 2
             ,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)frameBuffer,(Slice *)name);
  return;
}

Assistant:

void
insertSlice (
    Box2i&                    dataWindow,
    FrameBuffer&              frameBuffer,
    const char                name[],
    PixelType                 pixelType,
    list<Array2D<ValueType>>& channels)
{
    //
    // Allocate a pixel buffer and describe the layout of
    // the buffer in the FrameBuffer object.
    //

    size_t width  = dataWindow.max.x - dataWindow.min.x + 1;
    size_t height = dataWindow.max.y - dataWindow.min.y + 1;

    channels.emplace_back ();
    Array2D<ValueType>& buffer = channels.back ();
    buffer.resizeErase (height, width);

    char* base =
        (char*) (&buffer[0][0] - dataWindow.min.x - dataWindow.min.y * width);

    frameBuffer.insert (
        name, // name
        Slice (
            pixelType,                 // type
            base,                      // base
            sizeof (ValueType) * 1,    // xStride
            sizeof (ValueType) * width // yStride
            ));
}